

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_flow_mapping_key(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  int *piVar1;
  yaml_emitter_state_t *pyVar2;
  int iVar3;
  int first_local;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  if (first != 0) {
    iVar3 = yaml_emitter_write_indicator(emitter,"{",1,1,0);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = yaml_emitter_increase_indent(emitter,1,0);
    if (iVar3 == 0) {
      return 0;
    }
    emitter->flow_level = emitter->flow_level + 1;
  }
  if (event->type == YAML_MAPPING_END_EVENT) {
    emitter->flow_level = emitter->flow_level + -1;
    piVar1 = (emitter->indents).top;
    (emitter->indents).top = piVar1 + -1;
    emitter->indent = piVar1[-1];
    if ((emitter->canonical != 0) && (first == 0)) {
      iVar3 = yaml_emitter_write_indicator(emitter,",",0,0,0);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = yaml_emitter_write_indent(emitter);
      if (iVar3 == 0) {
        return 0;
      }
    }
    iVar3 = yaml_emitter_write_indicator(emitter,"}",0,0,0);
    if (iVar3 != 0) {
      pyVar2 = (emitter->states).top;
      (emitter->states).top = pyVar2 + -1;
      emitter->state = pyVar2[-1];
    }
    emitter_local._4_4_ = (uint)(iVar3 != 0);
    return emitter_local._4_4_;
  }
  if ((first == 0) && (iVar3 = yaml_emitter_write_indicator(emitter,",",0,0,0), iVar3 == 0)) {
    return 0;
  }
  if (((emitter->canonical != 0) || (emitter->best_width < emitter->column)) &&
     (iVar3 = yaml_emitter_write_indent(emitter), iVar3 == 0)) {
    return 0;
  }
  if ((emitter->canonical == 0) && (iVar3 = yaml_emitter_check_simple_key(emitter), iVar3 != 0)) {
    if (((emitter->states).top == (emitter->states).end) &&
       (iVar3 = yaml_stack_extend(&(emitter->states).start,&(emitter->states).top,
                                  &(emitter->states).end), iVar3 == 0)) {
      emitter->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar2 = (emitter->states).top;
    (emitter->states).top = pyVar2 + 1;
    *pyVar2 = YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE;
    iVar3 = yaml_emitter_emit_node(emitter,event,0,0,1,1);
    return iVar3;
  }
  iVar3 = yaml_emitter_write_indicator(emitter,"?",1,0,0);
  if (iVar3 == 0) {
    return 0;
  }
  if (((emitter->states).top == (emitter->states).end) &&
     (iVar3 = yaml_stack_extend(&(emitter->states).start,&(emitter->states).top,
                                &(emitter->states).end), iVar3 == 0)) {
    emitter->error = YAML_MEMORY_ERROR;
    return 0;
  }
  pyVar2 = (emitter->states).top;
  (emitter->states).top = pyVar2 + 1;
  *pyVar2 = YAML_EMIT_FLOW_MAPPING_VALUE_STATE;
  iVar3 = yaml_emitter_emit_node(emitter,event,0,0,1,0);
  return iVar3;
}

Assistant:

static int
yaml_emitter_emit_flow_mapping_key(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (first)
    {
        if (!yaml_emitter_write_indicator(emitter, "{", 1, 1, 0))
            return 0;
        if (!yaml_emitter_increase_indent(emitter, 1, 0))
            return 0;
        emitter->flow_level ++;
    }

    if (event->type == YAML_MAPPING_END_EVENT)
    {
        emitter->flow_level --;
        emitter->indent = POP(emitter, emitter->indents);
        if (emitter->canonical && !first) {
            if (!yaml_emitter_write_indicator(emitter, ",", 0, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }
        if (!yaml_emitter_write_indicator(emitter, "}", 0, 0, 0))
            return 0;
        emitter->state = POP(emitter, emitter->states);

        return 1;
    }

    if (!first) {
        if (!yaml_emitter_write_indicator(emitter, ",", 0, 0, 0))
            return 0;
    }
    if (emitter->canonical || emitter->column > emitter->best_width) {
        if (!yaml_emitter_write_indent(emitter))
            return 0;
    }

    if (!emitter->canonical && yaml_emitter_check_simple_key(emitter))
    {
        if (!PUSH(emitter, emitter->states,
                    YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE))
            return 0;

        return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 1);
    }
    else
    {
        if (!yaml_emitter_write_indicator(emitter, "?", 1, 0, 0))
            return 0;
        if (!PUSH(emitter, emitter->states,
                    YAML_EMIT_FLOW_MAPPING_VALUE_STATE))
            return 0;

        return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 0);
    }
}